

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.h
# Opt level: O0

command_node * __thiscall libchars::command_cursor::current(command_cursor *this)

{
  bool bVar1;
  const_reference ppcVar2;
  value_type local_20;
  command_cursor *this_local;
  
  bVar1 = std::
          stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
          ::empty(&this->S);
  if (bVar1) {
    local_20 = this->root;
  }
  else {
    ppcVar2 = std::
              stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
              ::top(&this->S);
    local_20 = *ppcVar2;
  }
  return local_20;
}

Assistant:

inline command_node *current() const { return S.empty() ? root : S.top(); }